

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_frs_al(void)

{
  uint addr_in;
  uint uVar1;
  uint uVar2;
  uint addr_in_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (m68ki_cpu.s_flag != 0 || m68ki_cpu.cpu_type == 1) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in_00 = pmmu_translate_addr(addr_in_00);
    }
    addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
    uVar2 = m68ki_cpu.x_flag >> 4;
    uVar3 = m68ki_cpu.n_flag >> 4;
    bVar6 = m68ki_cpu.not_z_flag == 0;
    uVar4 = m68ki_cpu.v_flag >> 6;
    uVar5 = m68ki_cpu.c_flag >> 8;
    uVar1 = m68ki_cpu.s_flag << 0xb | m68ki_cpu.t1_flag | m68ki_cpu.t0_flag |
            m68ki_cpu.m_flag << 0xb | m68ki_cpu.int_mask;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68k_write_memory_16
              (addr_in & m68ki_cpu.address_mask,
               uVar3 & 8 | uVar2 & 0x10 | (uint)bVar6 << 2 | uVar4 & 2 | uVar5 & 1 | uVar1);
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_move_16_frs_al(void)
{
	if(CPU_TYPE_IS_000(CPU_TYPE) || FLAG_S)	/* NS990408 */
	{
		uint ea = EA_AL_16();
		m68ki_write_16(ea, m68ki_get_sr());
		return;
	}
	m68ki_exception_privilege_violation();
}